

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O0

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar2;
  __type_conflict1 _Var3;
  istream *piVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  reference pvVar8;
  iterator __first;
  iterator __last;
  reference pvVar9;
  size_type sVar10;
  bool bVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_460;
  bool local_439;
  char local_405;
  char local_404;
  char local_403;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e0;
  undefined1 local_3c8 [8];
  string ename;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_390;
  const_iterator local_388;
  undefined1 local_380 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  iterator local_318;
  size_type local_310;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  iterator local_2c0;
  size_type local_2b8;
  string local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  string local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  string local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  undefined1 local_208 [8];
  string multiline;
  undefined1 local_1c8 [8];
  string item;
  string local_188;
  long local_168;
  size_type pos;
  string local_158;
  string local_138;
  string local_118 [32];
  string local_f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  ulong local_c0;
  size_t len;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_buffer;
  char aSep;
  char aEnd;
  char aStart;
  bool isINIArray;
  bool isDefaultArray;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string section;
  string line;
  istream *input_local;
  ConfigBase *this_local;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output;
  
  ::std::__cxx11::string::string((string *)(section.field_2._M_local_buf + 8));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"default",&local_61);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::vector(__return_storage_ptr__);
  bVar11 = false;
  if ((this->arrayStart == '[') && (bVar11 = false, this->arrayEnd == ']')) {
    bVar11 = this->arraySeparator == ',';
  }
  if ((this->arrayStart == '\0') || (bVar12 = false, this->arrayStart == ' ')) {
    bVar12 = this->arrayStart == this->arrayEnd;
  }
  if (bVar12) {
    local_403 = '[';
    local_404 = ']';
    if (this->arraySeparator == ' ') {
      local_405 = ',';
      goto LAB_0011cd59;
    }
  }
  else {
    local_403 = this->arrayStart;
    local_404 = this->arrayEnd;
  }
  local_405 = this->arraySeparator;
LAB_0011cd59:
  do {
    piVar4 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input,(string *)(section.field_2._M_local_buf + 8));
    bVar2 = ::std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) {
      bVar11 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_60,"default");
      if (bVar11) {
        ::std::__cxx11::string::string((string *)local_3c8);
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  (__return_storage_ptr__);
        detail::generate_parents(&local_3e0,(string *)local_60,(string *)local_3c8);
        pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                           (__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&pvVar9->parents,&local_3e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3e0);
        pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                           (__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)&pvVar9->name,"--");
        while( true ) {
          pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                             (__return_storage_ptr__);
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&pvVar9->parents);
          if (sVar10 < 2) break;
          pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                             (__return_storage_ptr__);
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (__return_storage_ptr__,pvVar9);
          pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                             (__return_storage_ptr__);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&pvVar9->parents);
        }
        ::std::__cxx11::string::~string((string *)local_3c8);
      }
      pos._4_4_ = 1;
      ::std::__cxx11::string::~string((string *)local_60);
      ::std::__cxx11::string::~string((string *)(section.field_2._M_local_buf + 8));
      return __return_storage_ptr__;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&name.field_2 + 8));
    ::std::__cxx11::string::string((string *)&len);
    detail::trim((string *)((long)&section.field_2 + 8));
    local_c0 = ::std::__cxx11::string::length();
    if (((local_c0 < 2) || (pcVar5 = (char *)::std::__cxx11::string::front(), *pcVar5 != '[')) ||
       (pcVar5 = (char *)::std::__cxx11::string::back(), *pcVar5 != ']')) {
      if (local_c0 == 0) {
        pos._4_4_ = 2;
      }
      else {
        pcVar5 = (char *)::std::__cxx11::string::front();
        if (((*pcVar5 == ';') || (pcVar5 = (char *)::std::__cxx11::string::front(), *pcVar5 == '#'))
           || (pcVar5 = (char *)::std::__cxx11::string::front(), *pcVar5 == this->commentChar)) {
          pos._4_4_ = 2;
        }
        else {
          local_168 = ::std::__cxx11::string::find
                                ((char)&section + '\x18',(ulong)(uint)(int)this->valueDelimiter);
          if (local_168 == -1) {
            detail::trim_copy(&local_308,(string *)((long)&section.field_2 + 8));
            ::std::__cxx11::string::operator=((string *)&len,(string *)&local_308);
            ::std::__cxx11::string::~string((string *)&local_308);
            __range2._6_1_ = 1;
            local_340 = &local_338;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_338,"true",(allocator<char> *)((long)&__range2 + 7));
            __range2._6_1_ = 0;
            local_318 = &local_338;
            local_310 = 1;
            __l._M_len = 1;
            __l._M_array = local_318;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&name.field_2 + 8),__l);
            local_4b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_318;
            do {
              local_4b8 = local_4b8 + -1;
              ::std::__cxx11::string::~string((string *)local_4b8);
            } while (local_4b8 != &local_338);
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
          }
          else {
            ::std::__cxx11::string::substr
                      ((ulong)((long)&item.field_2 + 8),(ulong)((long)&section.field_2 + 8));
            detail::trim_copy(&local_188,(string *)((long)&item.field_2 + 8));
            ::std::__cxx11::string::operator=((string *)&len,(string *)&local_188);
            ::std::__cxx11::string::~string((string *)&local_188);
            ::std::__cxx11::string::~string((string *)(item.field_2._M_local_buf + 8));
            ::std::__cxx11::string::substr
                      ((ulong)((long)&multiline.field_2 + 8),(ulong)((long)&section.field_2 + 8));
            detail::trim_copy((string *)local_1c8,(string *)((long)&multiline.field_2 + 8));
            ::std::__cxx11::string::~string((string *)(multiline.field_2._M_local_buf + 8));
            uVar6 = ::std::__cxx11::string::size();
            if ((uVar6 < 2) ||
               (pcVar5 = (char *)::std::__cxx11::string::front(), *pcVar5 != local_403)) {
              if (((bVar11) || (bVar12)) &&
                 (lVar7 = ::std::__cxx11::string::find_first_of
                                    ((char)local_1c8,(ulong)(uint)(int)local_405), lVar7 != -1)) {
                ::std::__cxx11::string::string((string *)&local_278,(string *)local_1c8);
                detail::split_up(&local_258,&local_278,local_405);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&name.field_2 + 8),&local_258);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_258);
                ::std::__cxx11::string::~string((string *)&local_278);
              }
              else if (((bVar11) || (bVar12)) &&
                      (lVar7 = ::std::__cxx11::string::find_first_of((char)local_1c8,0x20),
                      lVar7 != -1)) {
                ::std::__cxx11::string::string((string *)&local_2b0,(string *)local_1c8);
                detail::split_up(&local_290,&local_2b0,'\0');
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&name.field_2 + 8),&local_290);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_290);
                ::std::__cxx11::string::~string((string *)&local_2b0);
              }
              else {
                local_2e8 = &local_2e0;
                ::std::__cxx11::string::string((string *)local_2e8,(string *)local_1c8);
                local_2c0 = &local_2e0;
                local_2b8 = 1;
                __l_00._M_len = 1;
                __l_00._M_array = local_2c0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&name.field_2 + 8),__l_00);
                local_460 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_2c0;
                do {
                  local_460 = local_460 + -1;
                  ::std::__cxx11::string::~string((string *)local_460);
                } while (local_460 != &local_2e0);
              }
            }
            else {
              ::std::__cxx11::string::string((string *)local_208);
              while( true ) {
                pcVar5 = (char *)::std::__cxx11::string::back();
                local_439 = false;
                if (*pcVar5 != local_404) {
                  piVar4 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     (input,(string *)local_208);
                  local_439 = ::std::ios::operator_cast_to_bool
                                        ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
                }
                if (local_439 == false) break;
                detail::trim((string *)local_208);
                ::std::__cxx11::string::operator+=((string *)local_1c8,(string *)local_208);
              }
              pos._4_4_ = 4;
              ::std::__cxx11::string::~string((string *)local_208);
              ::std::__cxx11::string::length();
              ::std::__cxx11::string::substr((ulong)&local_240,(ulong)local_1c8);
              detail::split_up(&local_220,&local_240,local_405);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&name.field_2 + 8),&local_220);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_220);
              ::std::__cxx11::string::~string((string *)&local_240);
            }
            ::std::__cxx11::string::~string((string *)local_1c8);
          }
          lVar7 = ::std::__cxx11::string::find((char)&len,0x2e);
          if (lVar7 == -1) {
            detail::remove_quotes((string *)&len);
          }
          pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&name.field_2 + 8);
          __end2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar1);
          it = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar1);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&it), bVar2) {
            parents.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
            detail::remove_quotes
                      (parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end2);
          }
          detail::generate_parents
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_380,(string *)local_60,(string *)&len);
          bVar2 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::empty
                            (__return_storage_ptr__);
          if (bVar2) {
LAB_0011da42:
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                      (__return_storage_ptr__);
            pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                               (__return_storage_ptr__);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&pvVar9->parents,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_380);
            pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                               (__return_storage_ptr__);
            ::std::__cxx11::string::operator=((string *)&pvVar9->name,(string *)&len);
            pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                               (__return_storage_ptr__);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&pvVar9->inputs,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&name.field_2 + 8));
          }
          else {
            pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                               (__return_storage_ptr__);
            _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&len,&pvVar9->name);
            if (!_Var3) goto LAB_0011da42;
            pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                               (__return_storage_ptr__);
            bVar2 = ::std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_380,&pvVar9->parents);
            if (!bVar2) goto LAB_0011da42;
            pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                               (__return_storage_ptr__);
            pvVar8 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                               (__return_storage_ptr__);
            local_390._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&pvVar8->inputs);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_388,&local_390);
            pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&name.field_2 + 8);
            __first = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin(pvVar1);
            __last = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(pvVar1);
            ename.field_2._8_8_ =
                 ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                           ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            &pvVar9->inputs,local_388,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )__first._M_current,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )__last._M_current);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_380);
          pos._4_4_ = 0;
        }
      }
    }
    else {
      bVar2 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60,"default");
      if (bVar2) {
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  (__return_storage_ptr__);
        detail::generate_parents(&local_d8,(string *)local_60,(string *)&len);
        pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                           (__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&pvVar9->parents,&local_d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_d8);
        pvVar9 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                           (__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)&pvVar9->name,"--");
      }
      ::std::__cxx11::string::substr((ulong)local_f8,(ulong)((long)&section.field_2 + 8));
      ::std::__cxx11::string::operator=((string *)local_60,local_f8);
      ::std::__cxx11::string::~string(local_f8);
      uVar6 = ::std::__cxx11::string::size();
      if (((1 < uVar6) && (pcVar5 = (char *)::std::__cxx11::string::front(), *pcVar5 == '[')) &&
         (pcVar5 = (char *)::std::__cxx11::string::back(), *pcVar5 == ']')) {
        ::std::__cxx11::string::size();
        ::std::__cxx11::string::substr((ulong)local_118,(ulong)local_60);
        ::std::__cxx11::string::operator=((string *)local_60,local_118);
        ::std::__cxx11::string::~string(local_118);
      }
      ::std::__cxx11::string::string((string *)&local_158,(string *)local_60);
      detail::to_lower(&local_138,&local_158);
      bVar2 = ::std::operator==(&local_138,"default");
      ::std::__cxx11::string::~string((string *)&local_138);
      ::std::__cxx11::string::~string((string *)&local_158);
      if (bVar2) {
        ::std::__cxx11::string::operator=((string *)local_60,"default");
      }
      else {
        detail::checkParentSegments(__return_storage_ptr__,(string *)local_60);
      }
      pos._4_4_ = 2;
    }
    ::std::__cxx11::string::~string((string *)&len);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&name.field_2 + 8));
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string section = "default";

    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;

    while(getline(input, line)) {
        std::vector<std::string> items_buffer;
        std::string name;

        detail::trim(line);
        std::size_t len = line.length();
        if(len > 1 && line.front() == '[' && line.back() == ']') {
            if(section != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(section, name);
                output.back().name = "--";
            }
            section = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(section.size() > 1 && section.front() == '[' && section.back() == ']') {
                section = section.substr(1, section.size() - 2);
            }
            if(detail::to_lower(section) == "default") {
                section = "default";
            } else {
                detail::checkParentSegments(output, section);
            }
            continue;
        }
        if(len == 0) {
            continue;
        }
        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }

        // Find = in string, split and recombine
        auto pos = line.find(valueDelimiter);
        if(pos != std::string::npos) {
            name = detail::trim_copy(line.substr(0, pos));
            std::string item = detail::trim_copy(line.substr(pos + 1));
            if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item);
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line);
            items_buffer = {"true"};
        }
        if(name.find('.') == std::string::npos) {
            detail::remove_quotes(name);
        }
        // clean up quotes on the items
        for(auto &it : items_buffer) {
            detail::remove_quotes(it);
        }

        std::vector<std::string> parents = detail::generate_parents(section, name);

        if(!output.empty() && name == output.back().name && parents == output.back().parents) {
            output.back().inputs.insert(output.back().inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(section != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(section, ename);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}